

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeDisc.cpp
# Opt level: O2

int pzshape::TPZShapeDisc::NShapeF(int degree,int dimension,MShapeType type)

{
  int iVar1;
  int iVar2;
  
  switch(dimension) {
  case 0:
    return 1;
  case 1:
    return degree + 1;
  case 2:
    iVar2 = degree + 1;
    if ((type & ~ETensorialFull) == ETensorial) {
      return iVar2 * iVar2;
    }
    return (iVar2 * (degree + 2)) / 2;
  case 3:
    if ((type & ~ETensorialFull) == ETensorial) {
      iVar2 = degree + 1;
      return iVar2 * iVar2 * iVar2;
    }
    iVar2 = 0;
    iVar1 = 0;
    while (iVar1 <= degree) {
      iVar2 = ((uint)((iVar1 + 2) * (iVar1 + 1)) >> 1) + iVar2;
      iVar1 = iVar1 + 1;
    }
    break;
  default:
    std::operator<<((ostream *)&std::cerr,"TPZShapeDisc::NShapeF case does not exists\n");
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int  TPZShapeDisc::NShapeF(int degree, int dimension, MShapeType type) {
  int sum =0,i;
  switch(dimension) {
  case 0:
      return 1;
  case 1:
    return degree+1;
//    break;
  case 2:
    if(type == ETensorial || type == ETensorialFull) return (degree+1)*(degree+1);
    else return (degree+1)*(degree+2)/2;
//    break;
  case 3:
    if(type == ETensorial || type == ETensorialFull) return (degree+1)*(degree+1)*(degree+1);
    for(i=0;i<(degree+1);i++) sum += (i+1)*(i+2)/2;
    return sum;
 //   break;
  default:
      PZError << "TPZShapeDisc::NShapeF case does not exists\n";
      return -1;
  }
//  return -1;
}